

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O1

exr_result_t
exr_attr_opaquedata_unpack(exr_context_t ctxt,exr_attr_opaquedata_t *u,int32_t *sz,void **unpacked)

{
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  char *pcVar3;
  int32_t tmpusz;
  void *tmpuptr;
  int32_t local_24;
  void *local_20;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (sz != (int32_t *)0x0) {
      *sz = 0;
    }
    if (unpacked != (void **)0x0) {
      *unpacked = (void *)0x0;
    }
    if (u == (exr_attr_opaquedata_t *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar3 = "Invalid reference to opaque data object to initialize";
LAB_00113840:
      eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3);
      return eVar1;
    }
    pvVar2 = u->unpacked_data;
    if (pvVar2 == (void *)0x0) {
      if (u->unpack_func_ptr ==
          (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
        pcVar3 = "No unpack provider specified for opaque data";
        goto LAB_00113840;
      }
      eVar1 = (*u->unpack_func_ptr)(ctxt,u->packed_data,u->size,&local_24,&local_20);
      if (eVar1 != 0) {
        return eVar1;
      }
      u->unpacked_size = local_24;
      u->unpacked_data = local_20;
      pvVar2 = local_20;
      if (sz != (int32_t *)0x0) {
        *sz = local_24;
      }
    }
    else if (sz != (int32_t *)0x0) {
      *sz = u->unpacked_size;
    }
    eVar1 = 0;
    if (unpacked != (void **)0x0) {
      *unpacked = pvVar2;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_unpack (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, int32_t* sz, void** unpacked)
{
    exr_result_t rv;
    int32_t      tmpusz;
    void*        tmpuptr;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (sz) *sz = 0;
    if (unpacked) *unpacked = NULL;

    if (!u)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (u->unpacked_data)
    {
        if (sz) *sz = u->unpacked_size;
        if (unpacked) *unpacked = u->unpacked_data;
        return EXR_ERR_SUCCESS;
    }

    if (!u->unpack_func_ptr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No unpack provider specified for opaque data");
    rv = u->unpack_func_ptr (
        ctxt, u->packed_data, u->size, &(tmpusz), &(tmpuptr));
    if (rv == EXR_ERR_SUCCESS)
    {
        u->unpacked_size = tmpusz;
        u->unpacked_data = tmpuptr;
        if (sz) *sz = tmpusz;
        if (unpacked) *unpacked = tmpuptr;
    }

    return rv;
}